

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

void tcu::lookupLine(ColorLine *dst,ConstPixelBufferAccess *level,Sampler *sampler,int x0,int x1,
                    int y)

{
  bool bVar1;
  TextureFormat local_48;
  int aiStack_40 [2];
  TextureFormat local_38;
  int aiStack_30 [2];
  
  if ((((x0 < 0) || ((level->m_size).m_data[0] <= x0)) || (y < 0)) ||
     (((level->m_size).m_data[1] <= y || ((level->m_size).m_data[2] < 1)))) {
    sampleTextureBorder<float>((tcu *)&local_48,&level->m_format,sampler);
  }
  else {
    ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_38,(int)level,x0,y);
    bVar1 = isSRGB(level->m_format);
    if (bVar1) {
      sRGBToLinear((tcu *)&local_48,(Vec4 *)&local_38);
    }
    else {
      local_48 = local_38;
      aiStack_40[0] = aiStack_30[0];
      aiStack_40[1] = aiStack_30[1];
    }
  }
  (dst->p0).m_data[0] = (float)local_48.order;
  (dst->p0).m_data[1] = (float)local_48.type;
  *(int (*) [2])((dst->p0).m_data + 2) = aiStack_40;
  if (((x1 < 0) || ((level->m_size).m_data[0] <= x1)) ||
     ((y < 0 || (((level->m_size).m_data[1] <= y || ((level->m_size).m_data[2] < 1)))))) {
    sampleTextureBorder<float>((tcu *)&local_48,&level->m_format,sampler);
  }
  else {
    ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_38,(int)level,x1,y);
    bVar1 = isSRGB(level->m_format);
    if (bVar1) {
      sRGBToLinear((tcu *)&local_48,(Vec4 *)&local_38);
    }
    else {
      local_48 = local_38;
      aiStack_40[0] = aiStack_30[0];
      aiStack_40[1] = aiStack_30[1];
    }
  }
  (dst->p1).m_data[0] = (float)local_48.order;
  (dst->p1).m_data[1] = (float)local_48.type;
  *(int (*) [2])((dst->p1).m_data + 2) = aiStack_40;
  return;
}

Assistant:

static void lookupLine (ColorLine& dst, const ConstPixelBufferAccess& level, const Sampler& sampler, int x0, int x1, int y)
{
	dst.p0 = lookup<float>(level, sampler, x0, y, 0);
	dst.p1 = lookup<float>(level, sampler, x1, y, 0);
}